

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O3

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<std::vector<NDevice,std::allocator<NDevice>>&,std::vector<NTrodeObj,std::allocator<NTrodeObj>>&>
          (InputArchive<cereal::PortableBinaryInputArchive,1u> *this,
          vector<NDevice,_std::allocator<NDevice>_> *head,
          vector<NTrodeObj,_std::allocator<NTrodeObj>_> *tail)

{
  long lVar1;
  pointer pNVar2;
  pointer pNVar3;
  NDevice *v;
  pointer pNVar4;
  NTrodeObj *v_1;
  pointer this_00;
  size_type size;
  size_type local_30;
  
  lVar1 = *(long *)(*(long *)(this + 8) + 8);
  PortableBinaryInputArchive::loadBinary<8ul>
            (*(PortableBinaryInputArchive **)
              (*(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8) + 8),&local_30,8);
  std::vector<NDevice,_std::allocator<NDevice>_>::resize(head,local_30);
  pNVar2 = (head->super__Vector_base<NDevice,_std::allocator<NDevice>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar4 = (head->super__Vector_base<NDevice,_std::allocator<NDevice>_>)._M_impl.
                super__Vector_impl_data._M_start; pNVar4 != pNVar2; pNVar4 = pNVar4 + 1) {
    process<std::__cxx11::string&,int&,int&,std::vector<NDeviceChannel,std::allocator<NDeviceChannel>>&>
              (*(InputArchive<cereal::PortableBinaryInputArchive,1u> **)(*(long *)(lVar1 + 8) + 8),
               &pNVar4->name,&pNVar4->numBytes,&pNVar4->byteOffset,&pNVar4->channels);
  }
  lVar1 = *(long *)(*(long *)(this + 8) + 8);
  PortableBinaryInputArchive::loadBinary<8ul>
            (*(PortableBinaryInputArchive **)
              (*(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8) + 8),&local_30,8);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::resize(tail,local_30);
  pNVar3 = (tail->super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (tail->super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pNVar3; this_00 = this_00 + 1) {
    NTrodeObj::serialize<cereal::PortableBinaryInputArchive>
              (this_00,*(PortableBinaryInputArchive **)(*(long *)(lVar1 + 8) + 8));
  }
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }